

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O1

int CECoordinates::Observed2CIRS
              (double az,double zen,double *ra,double *dec,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type)

{
  int iVar1;
  double julian_date;
  double longitude;
  double latitude;
  double elevation_m;
  double pressure_hPa;
  double temperature_celsius;
  double relative_humidity;
  double dut1;
  double xp;
  double yp;
  double wavelength_um;
  double local_88;
  double local_80;
  
  local_88 = az;
  local_80 = zen;
  if (*angle_type == DEGREES) {
    local_88 = az * 0.017453292519943295;
    local_80 = zen * 0.017453292519943295;
  }
  (*date->_vptr_CEDate[4])(date);
  longitude = CEObserver::Longitude_Rad(observer);
  latitude = CEObserver::Latitude_Rad(observer);
  elevation_m = CEObserver::Elevation_m(observer);
  pressure_hPa = CEObserver::Pressure_hPa(observer);
  temperature_celsius = CEObserver::Temperature_C(observer);
  relative_humidity = CEObserver::RelativeHumidity(observer);
  dut1 = CEDate::dut1(date);
  xp = CEDate::xpolar(date);
  yp = CEDate::ypolar(date);
  wavelength_um = CEObserver::Wavelength_um(observer);
  iVar1 = Observed2CIRS(local_88,local_80,ra,dec,julian_date,longitude,latitude,elevation_m,
                        pressure_hPa,temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um)
  ;
  if (*angle_type == DEGREES) {
    *ra = *ra * 57.29577951308232;
    *dec = *dec * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2CIRS(double az, double zen,
                            double *ra, double *dec,
                            const CEDate&     date,
                            const CEObserver& observer,
                            const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        az *= DD2R ;
        zen *= DD2R ;
    }
    
    // Call the raw method
    int err_code = Observed2CIRS(az, zen, ra, dec, date.JD(),
                  observer.Longitude_Rad(), observer.Latitude_Rad(),
                  observer.Elevation_m(),
                  observer.Pressure_hPa(), observer.Temperature_C(),
                  observer.RelativeHumidity(),
                  date.dut1(),
                  date.xpolar(), 
                  date.ypolar(),
                  observer.Wavelength_um()) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *ra *= DR2D ;
        *dec *= DR2D ;
    }
    
    return err_code ;
}